

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle_rust.cc
# Opt level: O0

bool __thiscall
absl::lts_20250127::debugging_internal::anon_unknown_0::RustSymbolParser::ParseBase62Number
          (RustSymbolParser *this,int *value)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  undefined1 local_39;
  undefined4 local_2c;
  int digit;
  char c;
  bool overflowed;
  int encoded_number;
  int *value_local;
  RustSymbolParser *this_local;
  
  *value = -1;
  bVar1 = Eat(this,'_');
  if (bVar1) {
    *value = 0;
    this_local._7_1_ = true;
  }
  else {
    digit = 0;
    bVar1 = false;
    while( true ) {
      cVar2 = Peek(this);
      bVar3 = IsAlpha(cVar2);
      local_39 = true;
      if (!bVar3) {
        cVar2 = Peek(this);
        local_39 = IsDigit(cVar2);
      }
      if (local_39 == false) break;
      cVar2 = Take(this);
      iVar4 = std::numeric_limits<int>::max();
      if (digit < iVar4 / 0x3e) {
        bVar3 = IsDigit(cVar2);
        if (bVar3) {
          local_2c = cVar2 + -0x30;
        }
        else {
          bVar3 = IsLower(cVar2);
          if (bVar3) {
            local_2c = cVar2 + -0x57;
          }
          else {
            local_2c = cVar2 + -0x1d;
          }
        }
        digit = digit * 0x3e + local_2c;
      }
      else {
        bVar1 = true;
      }
    }
    bVar3 = Eat(this,'_');
    if (bVar3) {
      if (!bVar1) {
        *value = digit + 1;
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

ABSL_MUST_USE_RESULT bool ParseBase62Number(int& value) {
    value = -1;

    // base-62-number = (digit | lower | upper)* _
    //
    // An empty base-62 digit sequence means 0.
    if (Eat('_')) {
      value = 0;
      return true;
    }

    // A nonempty digit sequence denotes its base-62 value plus 1.
    int encoded_number = 0;
    bool overflowed = false;
    while (IsAlpha(Peek()) || IsDigit(Peek())) {
      const char c = Take();
      if (encoded_number >= std::numeric_limits<int>::max()/62) {
        // If we are close to overflowing an int, keep parsing but stop updating
        // encoded_number and remember to return -1 at the end.  The point is to
        // avoid undefined behavior while parsing crate-root disambiguators,
        // which are large in practice but not shown in demangling, while
        // successfully computing closure and shim disambiguators, which are
        // typically small and are printed out.
        overflowed = true;
      } else {
        int digit;
        if (IsDigit(c)) {
          digit = c - '0';
        } else if (IsLower(c)) {
          digit = c - 'a' + 10;
        } else {
          digit = c - 'A' + 36;
        }
        encoded_number = 62 * encoded_number + digit;
      }
    }

    if (!Eat('_')) return false;
    if (!overflowed) value = encoded_number + 1;
    return true;
  }